

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

array<char,_22UL> * libtorrent::aux::to_string(array<char,_22UL> *__return_storage_ptr__,int64_t n)

{
  bool bVar1;
  char *pcVar2;
  char *__src;
  ulong uVar3;
  
  __return_storage_ptr__->_M_elems[0x15] = '\0';
  uVar3 = -n;
  if (0 < n) {
    uVar3 = n;
  }
  pcVar2 = __return_storage_ptr__->_M_elems + 0x14;
  do {
    __src = pcVar2;
    *__src = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
    pcVar2 = __src + -1;
    bVar1 = 9 < uVar3;
    uVar3 = uVar3 / 10;
  } while (bVar1);
  if (n < 0) {
    *pcVar2 = '-';
    __src = pcVar2;
  }
  memmove(__return_storage_ptr__,__src,(long)__return_storage_ptr__ + (0x16 - (long)__src));
  return __return_storage_ptr__;
}

Assistant:

std::array<char, 4 + std::numeric_limits<std::int64_t>::digits10>
		to_string(std::int64_t const n)
	{
		std::array<char, 4 + std::numeric_limits<std::int64_t>::digits10> ret;
		char *p = &ret.back();
		*p = '\0';
		// we want "un" to be the absolute value
		// since the absolute of INT64_MIN cannot be represented by a signed
		// int64, we calculate the abs in unsigned space
		std::uint64_t un = n < 0
			? std::numeric_limits<std::uint64_t>::max() - std::uint64_t(n) + 1
			: std::uint64_t(n);
		do {
			*--p = char('0' + un % 10);
			un /= 10;
		} while (un);
		if (n < 0) *--p = '-';
		std::memmove(ret.data(), p, std::size_t(&ret.back() - p + 1));
		return ret;
	}